

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::anon_unknown_0::MixedApiCase::deinit(MixedApiCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  MixedApiCase *this_local;
  
  if (this->m_buffer != 0) {
    pRVar2 = gles31::Context::getRenderContext
                       ((this->super_BindingRenderCase).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_buffer);
    this->m_buffer = 0;
  }
  BindingRenderCase::deinit(&this->super_BindingRenderCase);
  return;
}

Assistant:

void MixedApiCase::deinit (void)
{
	if (m_buffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_buffer);
		m_buffer = DE_NULL;
	}

	BindingRenderCase::deinit();
}